

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

void __thiscall
glcts::StateInteractionCase::generateVarLinkVertexShaderSrc
          (StateInteractionCase *this,string *outVtxSrc,GLSLVersion glslVersion,int numOutputs)

{
  char *pcVar1;
  ostream *poVar2;
  uint uVar3;
  ostringstream vtxSrc;
  string local_1b0 [32];
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  poVar2 = std::operator<<(&local_190,pcVar1);
  std::operator<<(poVar2,"\n");
  if (8 < (int)glslVersion) {
    std::operator<<(&local_190,"out gl_PerVertex {\n  vec4 gl_Position;\n};\n");
  }
  std::operator<<(&local_190,"in highp vec4 a_position;\n");
  std::operator<<(&local_190,"uniform highp vec4 u_color;\n");
  uVar3 = numOutputs - 1;
  switch((ulong)uVar3) {
  case 4:
    std::operator<<(&local_190,"layout(location = 3) out vec4 o_val5;\n");
  case 3:
    std::operator<<(&local_190,"flat out uvec4 val4;\n");
  case 2:
    std::operator<<(&local_190,"flat out ivec2 val3;\n");
  case 1:
    std::operator<<(&local_190,"out vec3 val2[2];\n");
  case 0:
    std::operator<<(&local_190,"out vec4 val1;\n");
  default:
    std::operator<<(&local_190,"out float val0;\n");
    std::operator<<(&local_190,"void main (void)\n");
    std::operator<<(&local_190,"{\n");
    std::operator<<(&local_190,"   gl_Position = a_position;\n");
    if (uVar3 < 5) {
      pcVar1 = &DAT_0173ab30 + *(int *)(&DAT_0173ab30 + (ulong)uVar3 * 4);
    }
    else {
      pcVar1 = "    val0 = u_color.x;\n";
    }
    std::operator<<(&local_190,pcVar1);
    std::operator<<(&local_190,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)outVtxSrc,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    return;
  }
}

Assistant:

void generateVarLinkVertexShaderSrc(std::string& outVtxSrc, glu::GLSLVersion glslVersion, int numOutputs)
	{
		std::ostringstream vtxSrc;

		vtxSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		if (glslVersion >= glu::GLSL_VERSION_410)
		{
			vtxSrc << "out gl_PerVertex {\n"
					  "  vec4 gl_Position;\n"
					  "};\n";
		}
		vtxSrc << "in highp vec4 a_position;\n";
		vtxSrc << "uniform highp vec4 u_color;\n";

		switch (numOutputs)
		{
		// Note all these cases fall through
		case 5:
			vtxSrc << "layout(location = 3) out vec4 o_val5;\n";
		case 4:
			vtxSrc << "flat out uvec4 val4;\n";
		case 3:
			vtxSrc << "flat out ivec2 val3;\n";
		case 2:
			vtxSrc << "out vec3 val2[2];\n";
		case 1:
			vtxSrc << "out vec4 val1;\n";
		default:
			vtxSrc << "out float val0;\n";
		}

		vtxSrc << "void main (void)\n";
		vtxSrc << "{\n";
		vtxSrc << "   gl_Position = a_position;\n";

		// The color uniform is passed in the last declared output variable
		switch (numOutputs)
		{
		case 5:
			vtxSrc << "    o_val5 = u_color;\n";
			break;
		case 4:
			vtxSrc << "    val4 = uvec4(u_color);\n";
			break;
		case 3:
			vtxSrc << "    val3 = ivec2(u_color);\n";
			break;
		case 2:
			vtxSrc << "    val2[0] = vec3(u_color);\n";
			break;
		case 1:
			vtxSrc << "    val1 = u_color;\n";
			break;
		default:
			vtxSrc << "    val0 = u_color.x;\n";
			break;
		}
		vtxSrc << "}\n";

		outVtxSrc = vtxSrc.str();
	}